

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_context.c
# Opt level: O0

SUNErrCode SUNContext_GetProfiler(SUNContext sunctx,SUNProfiler *profiler)

{
  SUNContext sunctx_local_scope_;
  SUNProfiler *profiler_local;
  SUNContext sunctx_local;
  undefined4 local_4;
  
  if (sunctx == (SUNContext)0x0) {
    local_4 = -0x26f5;
  }
  else {
    *profiler = (SUNProfiler)0x0;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

SUNErrCode SUNContext_GetProfiler(SUNContext sunctx, SUNProfiler* profiler)
{
  if (!sunctx) { return SUN_ERR_SUNCTX_CORRUPT; }

  SUNFunctionBegin(sunctx);

#ifdef SUNDIALS_BUILD_WITH_PROFILING
  /* get profiler */
  *profiler = sunctx->profiler;
#else
  *profiler = NULL;
#endif

  return SUN_SUCCESS;
}